

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Model.cpp
# Opt level: O1

void CoreML::writeFeatureDescription(stringstream *ss,FeatureDescription *feature)

{
  string *psVar1;
  int iVar2;
  ostream *poVar3;
  ostream *poVar4;
  FeatureType *wrapped;
  string local_50;
  FeatureType local_30;
  
  poVar4 = (ostream *)(ss + 0x10);
  std::__ostream_insert<char,std::char_traits<char>>(poVar4,"\t\t",2);
  psVar1 = (feature->name_).ptr_;
  poVar3 = std::__ostream_insert<char,std::char_traits<char>>
                     (poVar4,(psVar1->_M_dataplus)._M_p,psVar1->_M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar3," (",2);
  wrapped = feature->type_;
  if (wrapped == (FeatureType *)0x0) {
    wrapped = (FeatureType *)&Specification::_FeatureType_default_instance_;
  }
  FeatureType::FeatureType(&local_30,wrapped);
  FeatureType::toString_abi_cxx11_(&local_50,&local_30);
  poVar3 = std::__ostream_insert<char,std::char_traits<char>>
                     (poVar3,local_50._M_dataplus._M_p,local_50._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar3,")",1);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50._M_dataplus._M_p != &local_50.field_2) {
    operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
  }
  if (local_30.m_type.
      super___shared_ptr<CoreML::Specification::FeatureType,_(__gnu_cxx::_Lock_policy)2>._M_refcount
      ._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_30.m_type.
               super___shared_ptr<CoreML::Specification::FeatureType,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
  }
  iVar2 = std::__cxx11::string::compare((char *)(feature->shortdescription_).ptr_);
  if (iVar2 != 0) {
    std::__ostream_insert<char,std::char_traits<char>>(poVar4,": ",2);
    psVar1 = (feature->shortdescription_).ptr_;
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar4,(psVar1->_M_dataplus)._M_p,psVar1->_M_string_length);
  }
  std::__ostream_insert<char,std::char_traits<char>>(poVar4,"\n",1);
  return;
}

Assistant:

static void writeFeatureDescription(std::stringstream& ss,
                                        const Specification::FeatureDescription& feature) {
        ss  << "\t\t"
            << feature.name()
            << " ("
            << FeatureType(feature.type()).toString()
            << ")";
        if (feature.shortdescription() != "") {
            ss << ": " << feature.shortdescription();
        }
        ss << "\n";
    }